

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot.cpp
# Opt level: O1

void ImPlot::SetNextPlotFormatY(char *fmt,ImPlotYAxis y_axis)

{
  ImPlotContext *pIVar1;
  
  pIVar1 = GImPlot;
  if (GImPlot->CurrentPlot != (ImPlotPlot *)0x0) {
    __assert_fail("(gp.CurrentPlot == __null) && \"SetNextPlotFormatY() needs to be called before BeginPlot()!\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/implot.cpp"
                  ,0xa4d,"void ImPlot::SetNextPlotFormatY(const char *, ImPlotYAxis)");
  }
  if ((uint)y_axis < 3) {
    (GImPlot->NextPlotData).HasFmtY[(uint)y_axis] = true;
    ImStrncpy((pIVar1->NextPlotData).FmtY[(uint)y_axis],fmt,0x10);
    return;
  }
  __assert_fail("(y_axis >= 0 && y_axis < 3) && \"y_axis needs to be between 0 and IMPLOT_Y_AXES\"",
                "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/implot.cpp"
                ,0xa4e,"void ImPlot::SetNextPlotFormatY(const char *, ImPlotYAxis)");
}

Assistant:

void SetNextPlotFormatY(const char* fmt, ImPlotYAxis y_axis) {
    ImPlotContext& gp = *GImPlot;
    IM_ASSERT_USER_ERROR(gp.CurrentPlot == NULL, "SetNextPlotFormatY() needs to be called before BeginPlot()!");
    IM_ASSERT_USER_ERROR(y_axis >= 0 && y_axis < IMPLOT_Y_AXES, "y_axis needs to be between 0 and IMPLOT_Y_AXES");
    gp.NextPlotData.HasFmtY[y_axis] = true;
    ImStrncpy(gp.NextPlotData.FmtY[y_axis], fmt, 16);
}